

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void phys_page_set_level(PhysPageMap *map,PhysPageEntry *lp,hwaddr *index,uint64_t *nb,uint16_t leaf
                        ,int level)

{
  PhysPageEntry *pPVar1;
  uint uVar2;
  Node *paPVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  PhysPageEntry PVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  bVar4 = (char)level * '\t';
  uVar6 = 1L << (bVar4 & 0x3f);
  PVar7 = *lp;
  if (0xffffffbf < (uint)PVar7 && ((uint)PVar7 & 0x3f) != 0) {
    uVar2 = map->nodes_nb;
    paPVar3 = map->nodes;
    map->nodes_nb = uVar2 + 1;
    if ((ulong)uVar2 == 0x3ffffff) {
      __assert_fail("ret != PHYS_MAP_NODE_NIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x85,"uint32_t phys_map_node_alloc(PhysPageMap *, _Bool)");
    }
    if (uVar2 == map->nodes_nb_alloc) {
      __assert_fail("ret != map->nodes_nb_alloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x86,"uint32_t phys_map_node_alloc(PhysPageMap *, _Bool)");
    }
    PVar7 = (PhysPageEntry)((uint)(level == 0) * 0x40 + (uint)(level != 0) + -0x40);
    lVar8 = 0;
    do {
      pPVar1 = paPVar3[uVar2] + lVar8;
      *pPVar1 = PVar7;
      pPVar1[1] = PVar7;
      pPVar1[2] = PVar7;
      pPVar1[3] = PVar7;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x200);
    PVar7 = (PhysPageEntry)((uint)*lp & 0x3f | uVar2 << 6);
    *lp = PVar7;
  }
  uVar5 = *nb;
  if (uVar5 != 0) {
    paPVar3 = map->nodes;
    uVar9 = (ulong)(((uint)(*index >> (bVar4 & 0x3f)) & 0x1ff) << 2);
    do {
      pPVar1 = (PhysPageEntry *)(&paPVar3[(uint)PVar7 >> 6][0].field_0x0 + uVar9);
      if (uVar5 < uVar6 || (*index & uVar6 - 1) != 0) {
        phys_page_set_level(map,pPVar1,index,nb,leaf,level + -1);
        uVar5 = *nb;
      }
      else {
        *pPVar1 = (PhysPageEntry)((uint)leaf << 6);
        *index = *index + uVar6;
        uVar5 = *nb - uVar6;
        *nb = uVar5;
      }
    } while ((uVar5 != 0) && (bVar10 = uVar9 < 0x7fc, uVar9 = uVar9 + 4, bVar10));
  }
  return;
}

Assistant:

static void phys_page_set_level(PhysPageMap *map, PhysPageEntry *lp,
                                hwaddr *index, uint64_t *nb, uint16_t leaf,
                                int level)
{
    PhysPageEntry *p;
    hwaddr step = (hwaddr)1 << (level * P_L2_BITS);

    if (lp->skip && lp->ptr == PHYS_MAP_NODE_NIL) {
        lp->ptr = phys_map_node_alloc(map, level == 0);
    }
    p = map->nodes[lp->ptr];
    lp = &p[(*index >> (level * P_L2_BITS)) & (P_L2_SIZE - 1)];

    while (*nb && lp < &p[P_L2_SIZE]) {
        if ((*index & (step - 1)) == 0 && *nb >= step) {
            lp->skip = 0;
            lp->ptr = leaf;
            *index += step;
            *nb -= step;
        } else {
            phys_page_set_level(map, lp, index, nb, leaf, level - 1);
        }
        ++lp;
    }
}